

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O0

void validator_mq_finish(_Bool unlink,mqd_t validator_mq,_Bool *err)

{
  int local_1c;
  int tmp_err;
  _Bool *err_local;
  mqd_t validator_mq_local;
  _Bool unlink_local;
  
  local_1c = mq_close(validator_mq);
  if (unlink) {
    local_1c = mq_unlink("/pw_validator_validator_mq_single");
  }
  if (local_1c == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                  ,"validator_mq_finish");
  }
  return;
}

Assistant:

void validator_mq_finish(bool unlink, mqd_t validator_mq, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;

    tmp_err = mq_close(validator_mq);
    if(unlink) {
        // intentionally performed before error checking to efficiently free resources in case of error
        tmp_err = mq_unlink(VALIDATOR_MQ_NAME);
    }
    VOID_FAIL_IF(tmp_err == -1);
}